

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O0

double __thiscall pstore::logger::log(logger *this,double __x)

{
  czstring __rhs;
  char *in_RDX;
  uint in_ESI;
  double dVar1;
  allocator local_a9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  czstring part1_local;
  logger *plStack_18;
  priority p_local;
  logger *this_local;
  quoted part2_local;
  
  plStack_18 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_a8,in_RDX,&local_a9);
  std::operator+(&local_88,&local_a8,'\"');
  __rhs = quoted::operator_cast_to_char_((quoted *)&this_local);
  std::operator+(&local_68,&local_88,__rhs);
  std::operator+(&local_48,&local_68,'\"');
  (*this->_vptr_logger[2])(this,(ulong)in_ESI,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_a8);
  dVar1 = (double)std::allocator<char>::~allocator((allocator<char> *)&local_a9);
  return dVar1;
}

Assistant:

void logger::log (priority const p, gsl::czstring const part1, quoted const part2) {
            this->log (p, std::string{part1} + '"' + static_cast<gsl::czstring> (part2) + '"');
        }